

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnBrOnExnExpr
          (ExprVisitorDelegate *this,BrOnExnExpr *expr)

{
  WatWriter *this_00;
  char *s;
  BrOnExnExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::BrOnExn_Opcode);
  WritePutsSpace(this_00,s);
  WriteBrVar(this->writer_,&expr->label_var,Space);
  WriteVar(this->writer_,&expr->event_var,Newline);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnBrOnExnExpr(BrOnExnExpr* expr) {
  writer_->WritePutsSpace(Opcode::BrOnExn_Opcode.GetName());
  writer_->WriteBrVar(expr->label_var, NextChar::Space);
  writer_->WriteVar(expr->event_var, NextChar::Newline);
  return Result::Ok;
}